

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getCookies
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  void *pvVar8;
  char *str;
  char *pcVar9;
  char cVar10;
  size_t len;
  undefined4 in_register_00000034;
  size_t keylen;
  undefined8 *puVar11;
  char *keystr;
  bool bVar12;
  
  if ((getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar6 != 0)) {
    getp_getCookies::desc.min_argc_ = 0;
    getp_getCookies::desc.opt_argc_ = 0;
    getp_getCookies::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookies::desc);
  if (iVar6 == 0) {
    puVar11 = *(undefined8 **)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    vVar7 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    uVar1 = (retval->val).obj;
    pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
    while (puVar11 = (undefined8 *)puVar11[2], puVar11 != (undefined8 *)0x0) {
      iVar6 = stricmp((char *)*puVar11,"cookie");
      if (iVar6 == 0) {
        pcVar9 = (char *)puVar11[1];
        bVar12 = *pcVar9 == '\0';
        while (!bVar12) {
          keystr = pcVar9 + -1;
          str = pcVar9;
          do {
            str = str + 1;
            cVar10 = keystr[1];
            keystr = keystr + 1;
            iVar6 = isspace((int)cVar10);
          } while (iVar6 != 0);
          keylen = 0;
LAB_00204e0f:
          if (cVar10 != '\0') {
            pvVar8 = memchr("=;,",(int)cVar10,4);
            if (pvVar8 == (void *)0x0) goto code_r0x00204e28;
            if (cVar10 == '=') {
              len = 0;
              pcVar9 = str;
              while ((*pcVar9 != '\0' &&
                     (pvVar8 = memchr(" \t;,",(int)*pcVar9,5), pvVar8 == (void *)0x0))) {
                pcVar9 = pcVar9 + 1;
                len = len + 1;
              }
              goto LAB_00204e70;
            }
          }
          pcVar9 = str + -1;
          str = "";
          len = 0;
LAB_00204e70:
          add_parsed_val((CVmObjLookupTable *)(pCVar2 + (uVar1 & 0xfff)),keystr,keylen,str,len,0);
          while( true ) {
            bVar12 = *pcVar9 == '\0';
            if ((bVar12) || (pvVar8 = memchr(" \t;,",(int)*pcVar9,5), pvVar8 == (void *)0x0)) break;
            pcVar9 = pcVar9 + 1;
          }
        }
      }
    }
    sp_ = sp_ + -1;
  }
  return 1;
code_r0x00204e28:
  cVar10 = *str;
  str = str + 1;
  keylen = keylen + 1;
  goto LAB_00204e0f;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookies(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* add this cookie to the table */
                add_parsed_val(vmg_ tab, name, namelen, val, vallen,
                               ENCMODE_NONE);

                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}